

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMatrixPic.cpp
# Opt level: O1

HighsStatus
writeMatrixPicToFile
          (HighsOptions *options,string *fileprefix,HighsInt numRow,HighsInt numCol,
          vector<int,_std::allocator<int>_> *Astart,vector<int,_std::allocator<int>_> *Aindex)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  pointer pcVar4;
  HighsStatus HVar5;
  size_type sVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  vector<int,_std::allocator<int>_> ARindex;
  vector<int,_std::allocator<int>_> ARstart;
  vector<int,_std::allocator<int>_> ARlength;
  vector<int,_std::allocator<int>_> local_b8;
  vector<int,_std::allocator<int>_> local_98;
  vector<int,_std::allocator<int>_> local_78;
  HighsOptions *local_60;
  value_type_conflict2 local_54;
  string local_50;
  
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  iVar7 = (Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[numCol];
  local_54 = 0;
  local_60 = options;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(&local_78,(long)numRow,&local_54);
  std::vector<int,_std::allocator<int>_>::resize(&local_98,(long)(numRow + 1));
  std::vector<int,_std::allocator<int>_>::resize(&local_b8,(long)iVar7);
  if (0 < iVar7) {
    piVar2 = (Aindex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    sVar6 = 0;
    do {
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[piVar2[sVar6]] =
           local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[piVar2[sVar6]] + 1;
      sVar6 = sVar6 + 1;
    } while ((long)iVar7 != sVar6);
  }
  *local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       0;
  if (0 < numRow) {
    iVar7 = *local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    uVar8 = 0;
    do {
      iVar7 = iVar7 + local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar8];
      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar8 + 1] = iVar7;
      uVar8 = uVar8 + 1;
    } while ((uint)numRow != uVar8);
  }
  if (0 < numCol) {
    piVar2 = (Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    piVar3 = (Aindex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    uVar8 = 0;
    do {
      lVar10 = (long)piVar2[uVar8];
      uVar9 = uVar8 + 1;
      if (piVar2[uVar8] < piVar2[uVar8 + 1]) {
        do {
          iVar7 = piVar3[lVar10];
          iVar1 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar7];
          local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar7] = iVar1 + 1;
          local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar1] = (int)uVar8;
          lVar10 = lVar10 + 1;
        } while (lVar10 < piVar2[uVar9]);
      }
      uVar8 = uVar9;
    } while (uVar9 != (uint)numCol);
  }
  *local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       0;
  if (0 < numRow) {
    iVar7 = *local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    uVar8 = 0;
    do {
      iVar7 = iVar7 + local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar8];
      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar8 + 1] = iVar7;
      uVar8 = uVar8 + 1;
    } while ((uint)numRow != uVar8);
  }
  pcVar4 = (fileprefix->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar4,pcVar4 + fileprefix->_M_string_length);
  HVar5 = writeRmatrixPicToFile(local_60,&local_50,numRow,numCol,&local_98,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return HVar5;
}

Assistant:

HighsStatus writeMatrixPicToFile(const HighsOptions& options,
                                 const std::string fileprefix,
                                 const HighsInt numRow, const HighsInt numCol,
                                 const std::vector<HighsInt>& Astart,
                                 const std::vector<HighsInt>& Aindex) {
  std::vector<HighsInt> ARlength;
  std::vector<HighsInt> ARstart;
  std::vector<HighsInt> ARindex;
  assert(numRow > 0);
  assert(numCol > 0);
  const HighsInt numNz = Astart[numCol];
  ARlength.assign(numRow, 0);
  ARstart.resize(numRow + 1);
  ARindex.resize(numNz);
  for (HighsInt iEl = 0; iEl < numNz; iEl++) ARlength[Aindex[iEl]]++;
  ARstart[0] = 0;
  for (HighsInt iRow = 0; iRow < numRow; iRow++)
    ARstart[iRow + 1] = ARstart[iRow] + ARlength[iRow];
  for (HighsInt iCol = 0; iCol < numCol; iCol++) {
    for (HighsInt iEl = Astart[iCol]; iEl < Astart[iCol + 1]; iEl++) {
      HighsInt iRow = Aindex[iEl];
      ARindex[ARstart[iRow]++] = iCol;
    }
  }
  ARstart[0] = 0;
  for (HighsInt iRow = 0; iRow < numRow; iRow++)
    ARstart[iRow + 1] = ARstart[iRow] + ARlength[iRow];

  return writeRmatrixPicToFile(options, fileprefix, numRow, numCol, ARstart,
                               ARindex);
}